

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::LoopPeelingPass::LoopPeelingInfo::GetFirstLoopInvariantOperand
          (LoopPeelingInfo *this,Instruction *condition)

{
  IRContext *this_00;
  bool bVar1;
  uint32_t uVar2;
  BasicBlock *bb;
  uint32_t uVar3;
  
  uVar3 = 0;
  do {
    uVar2 = Instruction::NumInOperands(condition);
    if (uVar2 <= uVar3) {
      return 0;
    }
    this_00 = this->context_;
    uVar2 = Instruction::GetSingleWordInOperand(condition,uVar3);
    bb = IRContext::get_instr_block(this_00,uVar2);
    if (bb != (BasicBlock *)0x0) {
      bVar1 = Loop::IsInsideLoop(this->loop_,bb);
      if (bVar1) {
        uVar3 = Instruction::GetSingleWordInOperand(condition,uVar3);
        return uVar3;
      }
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

uint32_t LoopPeelingPass::LoopPeelingInfo::GetFirstLoopInvariantOperand(
    Instruction* condition) const {
  for (uint32_t i = 0; i < condition->NumInOperands(); i++) {
    BasicBlock* bb =
        context_->get_instr_block(condition->GetSingleWordInOperand(i));
    if (bb && loop_->IsInsideLoop(bb)) {
      return condition->GetSingleWordInOperand(i);
    }
  }

  return 0;
}